

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPacking.cpp
# Opt level: O0

bool __thiscall
wasm::MemoryPacking::canSplit
          (MemoryPacking *this,
          unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *segment,
          Referrers *referrers)

{
  Expression *this_00;
  bool bVar1;
  pointer pDVar2;
  reference ppEVar3;
  MemoryInit *pMVar4;
  bool local_51;
  MemoryInit *curr;
  Expression *referrer;
  const_iterator __end1;
  const_iterator __begin1;
  Referrers *__range1;
  Referrers *referrers_local;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *segment_local;
  MemoryPacking *this_local;
  
  pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     (segment);
  bVar1 = IString::is((IString *)pDVar2);
  if (bVar1) {
    pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       (segment);
    bVar1 = IString::startsWith<7>((IString *)pDVar2,(char (*) [7])"__llvm");
    if (bVar1) {
      return false;
    }
  }
  __end1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin(referrers);
  referrer = (Expression *)
             std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end(referrers);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                *)&referrer);
    if (!bVar1) {
      pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(segment);
      local_51 = true;
      if ((pDVar2->isPassive & 1U) == 0) {
        pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                 operator->(segment);
        local_51 = Expression::is<wasm::Const>(pDVar2->offset);
      }
      return local_51;
    }
    ppEVar3 = __gnu_cxx::
              __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppEVar3;
    pMVar4 = Expression::dynCast<wasm::MemoryInit>(this_00);
    if (pMVar4 == (MemoryInit *)0x0) {
      bVar1 = Expression::is<wasm::ArrayNewSeg>(this_00);
      if ((bVar1) || (bVar1 = Expression::is<wasm::ArrayInit>(this_00), bVar1)) {
        return false;
      }
    }
    else {
      pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(segment);
      if (((pDVar2->isPassive & 1U) != 0) &&
         ((bVar1 = Expression::is<wasm::Const>(pMVar4->offset), !bVar1 ||
          (bVar1 = Expression::is<wasm::Const>(pMVar4->size), !bVar1)))) {
        return false;
      }
    }
    __gnu_cxx::
    __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool MemoryPacking::canSplit(const std::unique_ptr<DataSegment>& segment,
                             const Referrers& referrers) {
  // Don't mess with segments related to llvm coverage tools such as
  // __llvm_covfun. There segments are expected/parsed by external downstream
  // tools (llvm-cov) so they need to be left intact.
  // See https://clang.llvm.org/docs/SourceBasedCodeCoverage.html
  if (segment->name.is() && segment->name.startsWith("__llvm")) {
    return false;
  }

  for (auto* referrer : referrers) {
    if (auto* curr = referrer->dynCast<MemoryInit>()) {
      if (segment->isPassive) {
        // Do not try to split if there is a nonconstant offset or size
        if (!curr->offset->is<Const>() || !curr->size->is<Const>()) {
          return false;
        }
      }
    } else if (referrer->is<ArrayNewSeg>() || referrer->is<ArrayInit>()) {
      // TODO: Split segments referenced by GC instructions.
      return false;
    }
  }

  // Active segments can only be split if they have constant offsets
  return segment->isPassive || segment->offset->is<Const>();
}